

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass-utils.h
# Opt level: O0

void __thiscall
wasm::PassUtils::FilteredPass::runOnFunction(FilteredPass *this,Module *module,Function *func)

{
  size_type sVar1;
  pointer pPVar2;
  PassRunner *runner_;
  Function *local_20;
  Function *func_local;
  Module *module_local;
  FilteredPass *this_local;
  
  local_20 = func;
  func_local = (Function *)module;
  module_local = (Module *)this;
  sVar1 = std::
          unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::count(this->relevantFuncs,&local_20);
  if (sVar1 != 0) {
    pPVar2 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(&this->pass);
    runner_ = Pass::getPassRunner(&this->super_Pass);
    Pass::setPassRunner(pPVar2,runner_);
    pPVar2 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(&this->pass);
    (*pPVar2->_vptr_Pass[3])(pPVar2,func_local,local_20);
  }
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    if (!relevantFuncs.count(func)) {
      return;
    }

    // The pass runner calling us set our pass runner, which we must do for the
    // wrapped pass.
    pass->setPassRunner(getPassRunner());
    pass->runOnFunction(module, func);
  }